

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deck.cpp
# Opt level: O2

void __thiscall Deck::~Deck(Deck *this)

{
  _List_node_base *p_Var1;
  list<Card_*,_std::allocator<Card_*>_> *this_00;
  
  this->_vptr_Deck = (_func_int **)&PTR_revealDeck_00116098;
  this_00 = &this->deck;
  p_Var1 = (_List_node_base *)this_00;
  while (p_Var1 = (((_List_base<Card_*,_std::allocator<Card_*>_> *)&p_Var1->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var1 != (_List_node_base *)this_00) {
    std::__cxx11::list<Card_*,_std::allocator<Card_*>_>::remove(this_00,(char *)(p_Var1 + 1));
    p_Var1 = (this_00->super__List_base<Card_*,_std::allocator<Card_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
  }
  std::__cxx11::_List_base<Card_*,_std::allocator<Card_*>_>::_M_clear
            (&this_00->super__List_base<Card_*,_std::allocator<Card_*>_>);
  return;
}

Assistant:

Deck::~Deck() 
{
    list <Card*>::iterator it;

    for (it = deck.begin(); it != deck.end(); it++)
    {
        deck.remove((*it));
        //delete *it;
        it = deck.begin();
    }
}